

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::FilterNode::do_render
          (FilterNode *this,ostringstream *out,shared_ptr<minja::Context> *context)

{
  initializer_list<minja::Value> __l;
  bool bVar1;
  runtime_error *prVar2;
  ostream *in_RSI;
  Value *in_RDI;
  Value result;
  ArgumentsValue filter_args;
  string rendered_body;
  Value filter_value;
  Value *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffdb8;
  Value *in_stack_fffffffffffffdc0;
  iterator in_stack_fffffffffffffdc8;
  Value *this_00;
  size_type in_stack_fffffffffffffdd0;
  undefined8 **ppuVar3;
  undefined1 **local_228;
  ArgumentsValue *in_stack_fffffffffffffdf8;
  shared_ptr<minja::Context> *in_stack_fffffffffffffe00;
  string local_1f0 [120];
  undefined8 *local_178;
  undefined1 *local_170 [10];
  undefined8 *local_120;
  undefined8 local_118;
  string local_e0 [16];
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  Value *in_stack_ffffffffffffff38;
  string local_98 [8];
  shared_ptr<minja::Context> *in_stack_ffffffffffffff70;
  Expression *in_stack_ffffffffffffff78;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->object_);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"FilterNode.filter is null");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->callable_);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"FilterNode.body is null");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x345a1e);
  Expression::evaluate(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  bVar1 = Value::is_callable((Value *)0x345a43);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    Value::dump_abi_cxx11_
              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
               SUB41((uint)in_stack_ffffffffffffff30 >> 0x18,0));
    std::operator+(in_stack_fffffffffffffd98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd90);
    std::runtime_error::runtime_error(prVar2,local_98);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x345b5d);
  TemplateNode::render_abi_cxx11_
            ((TemplateNode *)in_stack_ffffffffffffff38,
             (shared_ptr<minja::Context> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  local_178 = local_170;
  Value::Value(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_120 = local_170;
  local_118 = 1;
  std::allocator<minja::Value>::allocator((allocator<minja::Value> *)0x345bd1);
  __l._M_len = in_stack_fffffffffffffdd0;
  __l._M_array = in_stack_fffffffffffffdc8;
  std::vector<minja::Value,_std::allocator<minja::Value>_>::vector
            ((vector<minja::Value,_std::allocator<minja::Value>_> *)in_stack_fffffffffffffdc0,__l,
             (allocator_type *)in_stack_fffffffffffffdb8);
  this_00 = (Value *)&stack0xffffffffffffff08;
  memset(this_00,0,0x18);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
            *)0x345c19);
  std::allocator<minja::Value>::~allocator((allocator<minja::Value> *)0x345c26);
  ppuVar3 = (undefined8 **)local_170;
  local_228 = (undefined1 **)&local_120;
  do {
    local_228 = local_228 + -10;
    Value::~Value(in_stack_fffffffffffffd90);
  } while ((undefined8 **)local_228 != ppuVar3);
  Value::call(in_RDI,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Value::to_str_abi_cxx11_(this_00);
  std::operator<<(in_RSI,local_1f0);
  std::__cxx11::string::~string(local_1f0);
  Value::~Value(in_stack_fffffffffffffd90);
  ArgumentsValue::~ArgumentsValue((ArgumentsValue *)in_stack_fffffffffffffd90);
  std::__cxx11::string::~string(local_e0);
  Value::~Value(in_stack_fffffffffffffd90);
  return;
}

Assistant:

void do_render(std::ostringstream & out, const std::shared_ptr<Context> & context) const override {
        if (!filter) throw std::runtime_error("FilterNode.filter is null");
        if (!body) throw std::runtime_error("FilterNode.body is null");
        auto filter_value = filter->evaluate(context);
        if (!filter_value.is_callable()) {
            throw std::runtime_error("Filter must be a callable: " + filter_value.dump());
        }
        std::string rendered_body = body->render(context);

        ArgumentsValue filter_args = {{Value(rendered_body)}, {}};
        auto result = filter_value.call(context, filter_args);
        out << result.to_str();
    }